

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall
front::irGenerator::irGenerator::ir_declare_param
          (irGenerator *this,string *name,SymbolKind kind,int id)

{
  PtrTy *this_00;
  SharedTyPtr *item;
  value_type *__x;
  iterator this_01;
  int in_EDX;
  string *in_RSI;
  long in_RDI;
  SharedTyPtr ty;
  localArrayInitType in_stack_000009f4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_000009f8;
  int in_stack_00000a00;
  SymbolKind in_stack_00000a04;
  string *in_stack_00000a08;
  irGenerator *in_stack_00000a10;
  int in_stack_00000a20;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffeec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffef0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff00;
  string local_48 [52];
  int local_14;
  
  local_14 = in_EDX;
  std::shared_ptr<mir::types::Ty>::shared_ptr((shared_ptr<mir::types::Ty> *)0x25fe94);
  std::__cxx11::string::string(local_48,in_RSI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x25fee7);
  uVar1 = 0;
  ir_declare_value(in_stack_00000a10,in_stack_00000a08,in_stack_00000a04,in_stack_00000a00,
                   in_stack_000009f8,in_stack_000009f4,in_stack_00000a20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffff00);
  std::__cxx11::string::~string(local_48);
  if (local_14 == 0) {
    operator_new(8);
    mir::types::IntTy::IntTy((IntTy *)in_stack_fffffffffffffef0);
    std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
              ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffef0,
               (IntTy *)CONCAT44(in_stack_fffffffffffffeec,uVar1));
    std::shared_ptr<mir::types::Ty>::operator=
              ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffef0,
               (shared_ptr<mir::types::Ty> *)CONCAT44(in_stack_fffffffffffffeec,uVar1));
    std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25fff0);
  }
  else if (local_14 == 4) {
    this_00 = (PtrTy *)operator_new(0x18);
    item = (SharedTyPtr *)operator_new(8);
    mir::types::IntTy::IntTy((IntTy *)in_stack_fffffffffffffef0);
    std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
              ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffef0,
               (IntTy *)CONCAT44(in_stack_fffffffffffffeec,uVar1));
    mir::types::PtrTy::PtrTy(this_00,item);
    std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
              ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffef0,
               (PtrTy *)CONCAT44(in_stack_fffffffffffffeec,uVar1));
    std::shared_ptr<mir::types::Ty>::operator=
              ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffef0,
               (shared_ptr<mir::types::Ty> *)CONCAT44(in_stack_fffffffffffffeec,uVar1));
    std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x2600ad);
    std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x2600b7);
  }
  __x = (value_type *)(in_RDI + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back(in_stack_fffffffffffffef0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
            ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                    *)CONCAT44(in_stack_fffffffffffffeec,uVar1),(key_type *)0x260158);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                *)0x260173);
  std::__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x26017f);
  std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
  push_back((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
             *)this_01._M_node,__x);
  std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x2601a2);
  return;
}

Assistant:

void irGenerator::ir_declare_param(string name, symbol::SymbolKind kind,
                                   int id) {
  SharedTyPtr ty;

  ir_declare_value(name, kind, id, {});

  switch (kind) {
    case front::symbol::SymbolKind::INT: {
      ty = SharedTyPtr(new IntTy());
      break;
    }
    case front::symbol::SymbolKind::Ptr: {
      ty = SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy())));
      break;
    }
    default:
      break;
  }
  _package.functions.find(_funcStack.back())->second.type->params.push_back(ty);
}